

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O1

uint Ivy_CutGetTruth_rec(Ivy_Man_t *p,int Leaf,int *pNums,int nNums)

{
  void *pvVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  while( true ) {
    if (0 < nNums) {
      lVar4 = 0;
      do {
        if (*(uint *)((long)pNums + lVar4) == Leaf) {
          return *(uint *)((long)Ivy_CutGetTruth_rec::uMasks + lVar4);
        }
        lVar4 = lVar4 + 4;
      } while ((ulong)(uint)nNums * 4 != lVar4);
    }
    uVar3 = Leaf >> 8;
    if (((int)uVar3 < 0) || (p->vObjs->nSize <= (int)uVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar1 = p->vObjs->pArray[uVar3];
    uVar3 = *(uint *)((long)pvVar1 + 8) & 0xf;
    if (uVar3 != 4) {
      if (uVar3 - 5 < 3) {
        if (*(ulong *)((long)pvVar1 + 0x10) == 0) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(int *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) << 8;
        }
        uVar3 = Ivy_CutGetTruth_rec(p,uVar3 | Leaf & 0xffU,pNums,nNums);
        uVar3 = -(*(uint *)((long)pvVar1 + 0x10) & 1) ^ uVar3;
        if ((*(uint *)((long)pvVar1 + 8) & 0xf) != 7) {
          if (*(ulong *)((long)pvVar1 + 0x18) == 0) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(int *)(*(ulong *)((long)pvVar1 + 0x18) & 0xfffffffffffffffe) << 8;
          }
          uVar5 = Ivy_CutGetTruth_rec(p,uVar5 | Leaf & 0xffU,pNums,nNums);
          uVar3 = uVar3 & (-(*(uint *)((long)pvVar1 + 0x18) & 1) ^ uVar5);
        }
        return uVar3;
      }
      __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                    ,0x240,"unsigned int Ivy_CutGetTruth_rec(Ivy_Man_t *, int, int *, int)");
    }
    piVar2 = *(int **)((long)pvVar1 + 0x10);
    if (((ulong)piVar2 & 1) != 0) break;
    if (piVar2 == (int *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *piVar2 << 8;
    }
    Leaf = (Leaf & 0xffU) + 1 | uVar3;
  }
  __assert_fail("!Ivy_ObjFaninC0(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                ,0x23c,"unsigned int Ivy_CutGetTruth_rec(Ivy_Man_t *, int, int *, int)");
}

Assistant:

unsigned Ivy_CutGetTruth_rec( Ivy_Man_t * p, int Leaf, int * pNums, int nNums )
{
    static unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth0, uTruth1;
    Ivy_Obj_t * pObj;
    int i;
    for ( i = 0; i < nNums; i++ )
        if ( Leaf == pNums[i] )
            return uMasks[i];
    pObj = Ivy_ManObj( p, Ivy_LeafId(Leaf) );
    if ( Ivy_ObjIsLatch(pObj) )
    {
        assert( !Ivy_ObjFaninC0(pObj) );
        Leaf = Ivy_LeafCreate( Ivy_ObjFaninId0(pObj), Ivy_LeafLat(Leaf) + 1 );
        return Ivy_CutGetTruth_rec( p, Leaf, pNums, nNums );
    }
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    Leaf = Ivy_LeafCreate( Ivy_ObjFaninId0(pObj), Ivy_LeafLat(Leaf) );
    uTruth0 = Ivy_CutGetTruth_rec( p, Leaf, pNums, nNums );
    if ( Ivy_ObjFaninC0(pObj) )
        uTruth0 = ~uTruth0;
    if ( Ivy_ObjIsBuf(pObj) )
        return uTruth0;
    Leaf = Ivy_LeafCreate( Ivy_ObjFaninId1(pObj), Ivy_LeafLat(Leaf) );
    uTruth1 = Ivy_CutGetTruth_rec( p, Leaf, pNums, nNums );
    if ( Ivy_ObjFaninC1(pObj) )
        uTruth1 = ~uTruth1;
    return uTruth0 & uTruth1;
}